

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O0

bool google::protobuf::internal::AllAreInitialized<google::protobuf::OneofDescriptorProto>
               (RepeatedPtrField<google::protobuf::OneofDescriptorProto> *t)

{
  bool bVar1;
  const_reference this;
  int local_1c;
  int i;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *t_local;
  
  local_1c = RepeatedPtrField<google::protobuf::OneofDescriptorProto>::size(t);
  do {
    local_1c = local_1c + -1;
    if (local_1c < 0) {
      return true;
    }
    this = RepeatedPtrField<google::protobuf::OneofDescriptorProto>::Get(t,local_1c);
    bVar1 = OneofDescriptorProto::IsInitialized(this);
  } while (bVar1);
  return false;
}

Assistant:

bool AllAreInitialized(const RepeatedPtrField<Msg>& t) {
  for (int i = t.size(); --i >= 0;) {
    if (!t.Get(i).IsInitialized()) return false;
  }
  return true;
}